

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_test.cpp
# Opt level: O2

void __thiscall
vm_test_disassemble_prog_Test::vm_test_disassemble_prog_Test(vm_test_disassemble_prog_Test *this)

{
  anon_unknown.dwarf_1947c::vm_test::vm_test(&this->super_vm_test);
  (this->super_vm_test).super_Test._vptr_Test = (_func_int **)&PTR__vm_test_001783d8;
  return;
}

Assistant:

TEST_F(vm_test, disassemble_prog) {
  std::string prog = "push 1\ndup\nzero\nrandn 2\nrotln 3\njump 23";
  std::istringstream sstr(prog);

  auto res = vm1.disassemble(std::get<1>(vm1.assemble(sstr)).value());
  EXPECT_EQ(std::get<0>(res), status_type::SUCCESS);
  EXPECT_TRUE(std::get<1>(res));
  EXPECT_EQ(std::get<1>(res).value(), prog + "\n");
}